

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall Lexer::lexLine(Lexer *this)

{
  ulong uVar1;
  Token token;
  undefined1 local_c0 [16];
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [48];
  undefined1 local_60 [48];
  
  while( true ) {
    uVar1 = (this->_currentLine)._M_string_length;
    if (uVar1 == (long)this->_currentColumnNo) {
      return;
    }
    if (uVar1 <= (ulong)(long)this->_currentColumnNo) break;
    local_c0._0_4_ = NullToken;
    local_c0._4_4_ = 0;
    local_c0._8_4_ = 0;
    local_b0._M_p = (pointer)&local_a0;
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    do {
      readToken((Token *)local_60,this);
      Token::operator=((Token *)local_c0,(Token *)local_60);
      std::__cxx11::string::~string((string *)(local_60 + 0x10));
      Token::Token((Token *)local_90,(Token *)local_c0);
      emitToken(this,(Token *)local_90);
      std::__cxx11::string::~string((string *)(local_90 + 0x10));
    } while (local_c0._0_4_ != LineTerminatorToken);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  __assert_fail("_currentColumnNo < _currentLine.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cubuspl42[P]aghsm/Lexer.cpp"
                ,0xb9,"void Lexer::lexLine()");
}

Assistant:

void Lexer::lexLine() {
    while(_currentColumnNo != _currentLine.size()) {
        assert(_currentColumnNo < _currentLine.size());
        Token token{Token::NullToken};
        do {
            token = readToken();
            emitToken(token);
        } while(token.type != Token::LineTerminatorToken);
    }
}